

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alf_exporter.cpp
# Opt level: O0

unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> make_alf_file(fitting_result *data)

{
  value_type_conflict vVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  pointer paVar6;
  ltc_store_data *this;
  const_reference pvVar7;
  reference pvVar8;
  fitting_result *in_RSI;
  ltc_store_data *params;
  uint base_tex2;
  uint base_tex1;
  uint matrix_index;
  int alpha;
  int theta;
  uint num_samples;
  fitting_result *data_local;
  __single_object *file;
  
  std::make_unique<alf::alf_file>();
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  strcpy((char *)paVar6,"ALF");
  uVar3 = in_RSI->num_samples_angle;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  (paVar6->header).num_samples_angle = uVar3;
  uVar3 = in_RSI->num_samples_roughness;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  (paVar6->header).num_samples_roughness = uVar3;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  (paVar6->header).version_major = 1;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  (paVar6->header).version_minor = 0;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  uVar3 = (paVar6->header).num_samples_angle;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  iVar4 = uVar3 * (paVar6->header).num_samples_roughness;
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  std::vector<float,_std::allocator<float>_>::resize
            (&paVar6->texture_slot1,(ulong)(uint)(iVar4 * 4));
  paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                     ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
  std::vector<float,_std::allocator<float>_>::resize
            (&paVar6->texture_slot2,(ulong)(uint)(iVar4 * 3));
  for (matrix_index = 0;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data),
      matrix_index < (paVar6->header).num_samples_angle; matrix_index = matrix_index + 1) {
    for (base_tex1 = 0;
        paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                           ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data),
        base_tex1 < (paVar6->header).num_samples_roughness; base_tex1 = base_tex1 + 1) {
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      iVar4 = (paVar6->header).num_samples_roughness * matrix_index + base_tex1;
      uVar5 = iVar4 * 4;
      uVar3 = iVar4 * 3;
      this = fitting_result::getData(in_RSI,matrix_index,base_tex1);
      pvVar7 = std::array<float,_5UL>::operator[](&this->matrix_parameters,0);
      vVar1 = *pvVar7;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot1,(ulong)uVar5);
      *pvVar8 = vVar1;
      pvVar7 = std::array<float,_5UL>::operator[](&this->matrix_parameters,1);
      vVar1 = *pvVar7;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot1,(ulong)(uVar5 + 1));
      *pvVar8 = vVar1;
      pvVar7 = std::array<float,_5UL>::operator[](&this->matrix_parameters,2);
      vVar1 = *pvVar7;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot1,(ulong)(uVar5 + 2));
      *pvVar8 = vVar1;
      pvVar7 = std::array<float,_5UL>::operator[](&this->matrix_parameters,3);
      vVar1 = *pvVar7;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot1,(ulong)(uVar5 + 3));
      *pvVar8 = vVar1;
      pvVar7 = std::array<float,_5UL>::operator[](&this->matrix_parameters,4);
      vVar1 = *pvVar7;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot2,(ulong)uVar3);
      *pvVar8 = vVar1;
      fVar2 = this->distribution_norm;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot2,(ulong)(uVar3 + 1));
      *pvVar8 = fVar2;
      fVar2 = this->fresnel_term;
      paVar6 = std::unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_>::operator->
                         ((unique_ptr<alf::alf_file,_std::default_delete<alf::alf_file>_> *)data);
      pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&paVar6->texture_slot2,(ulong)(uVar3 + 2));
      *pvVar8 = fVar2;
    }
  }
  return (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)
         (__uniq_ptr_data<alf::alf_file,_std::default_delete<alf::alf_file>,_true,_true>)data;
}

Assistant:

std::unique_ptr<alf::alf_file> make_alf_file(const fitting_result &data)
{
  auto file = std::make_unique<alf::alf_file>();

  std::strcpy(file->header.id, "ALF");
  file->header.num_samples_angle = data.num_samples_angle;
  file->header.num_samples_roughness = data.num_samples_roughness;
  file->header.version_major = 1;
  file->header.version_minor = 0;

  auto num_samples = file->header.num_samples_angle * file->header.num_samples_roughness;
  file->texture_slot1.resize(4 * num_samples);
  file->texture_slot2.resize(3 * num_samples);

  for (auto theta = 0; theta < file->header.num_samples_angle; ++theta)
  {
    for (auto alpha = 0; alpha < file->header.num_samples_roughness; ++alpha)
    {
      auto matrix_index = file->header.num_samples_roughness * theta + alpha;
      auto base_tex1 = 4 * matrix_index;
      auto base_tex2 = 3 * matrix_index;

      const auto& params = data.getData(theta, alpha);

      file->texture_slot1[base_tex1+0] = params.matrix_parameters[0];
      file->texture_slot1[base_tex1+1] = params.matrix_parameters[1];
      file->texture_slot1[base_tex1+2] = params.matrix_parameters[2];
      file->texture_slot1[base_tex1+3] = params.matrix_parameters[3];

      file->texture_slot2[base_tex2+0] = params.matrix_parameters[4];
      file->texture_slot2[base_tex2+1] = params.distribution_norm;
      file->texture_slot2[base_tex2+2] = params.fresnel_term;
    }
  }

  return file;
}